

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# special_functions.hpp
# Opt level: O0

double trng::math::Phi(double x)

{
  double in_XMM0_Qa;
  double dVar1;
  undefined8 local_8;
  
  dVar1 = in_XMM0_Qa * 0.7071067811865476;
  if (-0.4769362762044699 <= dVar1) {
    if (dVar1 <= 0.4769362762044699) {
      dVar1 = erf(dVar1);
      local_8 = dVar1 * 0.5 + 0.5;
    }
    else {
      dVar1 = erfc(dVar1);
      local_8 = dVar1 * -0.5 + 1.0;
    }
  }
  else {
    local_8 = erfc(-dVar1);
    local_8 = local_8 * 0.5;
  }
  return local_8;
}

Assistant:

TRNG_CUDA_ENABLE
    inline double Phi(double x) {
      x *= constants<double>::one_over_sqrt_2;
      if (x < -0.6744897501960817 * constants<double>::one_over_sqrt_2)
        return 0.5 * erfc(-x);
      if (x > +0.6744897501960817 * constants<double>::one_over_sqrt_2)
        return 1.0 - 0.5 * erfc(x);
      return 0.5 + 0.5 * erf(x);
    }